

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

void __thiscall
bandit::detail::option_map::add
          (option_map *this,string *name,controller_func_t *func,bool is_default)

{
  size_type sVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>,_bool>
  pVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>
  local_78;
  _Base_ptr local_38;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>,_bool>
  it;
  bool is_default_local;
  controller_func_t *func_local;
  string *name_local;
  option_map *this_local;
  
  it._15_1_ = is_default;
  std::make_pair<std::__cxx11::string_const&,std::function<void(bandit::detail::controller_t&)>&>
            (&local_78,name,func);
  pVar2 = std::
          map<std::__cxx11::string,std::function<void(bandit::detail::controller_t&)>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(bandit::detail::controller_t&)>>>>
          ::
          emplace<std::pair<std::__cxx11::string,std::function<void(bandit::detail::controller_t&)>>>
                    ((map<std::__cxx11::string,std::function<void(bandit::detail::controller_t&)>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(bandit::detail::controller_t&)>>>>
                      *)this,&local_78);
  local_38 = (_Base_ptr)pVar2.first._M_node;
  it.first._M_node._0_1_ = pVar2.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>
  ::~pair(&local_78);
  if (((it._15_1_ & 1) == 0) &&
     (sVar1 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>_>
              ::size(&this->map), sVar1 != 1)) {
    return;
  }
  (this->default_it)._M_node = local_38;
  return;
}

Assistant:

void add(const std::string& name, controller_func_t func, bool is_default = false) {
        auto it = map.emplace(std::make_pair(name, func));
        if (is_default || map.size() == 1) {
          default_it = it.first;
        }
      }